

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

xmlElementPtr xmlGetDtdElementDesc2(xmlValidCtxtPtr ctxt,xmlDtdPtr dtd,xmlChar *name)

{
  int iVar1;
  xmlHashTablePtr pxVar2;
  xmlChar *pxVar3;
  xmlDictPtr local_50;
  xmlDictPtr dict;
  xmlChar *prefix;
  xmlChar *localName;
  xmlElementPtr cur;
  xmlElementTablePtr table;
  xmlChar *name_local;
  xmlDtdPtr dtd_local;
  xmlValidCtxtPtr ctxt_local;
  
  localName = (xmlChar *)0x0;
  dict = (xmlDictPtr)0x0;
  if (dtd == (xmlDtdPtr)0x0) {
    return (xmlElementPtr)0x0;
  }
  table = (xmlElementTablePtr)name;
  name_local = (xmlChar *)dtd;
  dtd_local = (xmlDtdPtr)ctxt;
  if (dtd->elements == (void *)0x0) {
    local_50 = (xmlDictPtr)0x0;
    if (dtd->doc != (_xmlDoc *)0x0) {
      local_50 = dtd->doc->dict;
    }
    pxVar2 = xmlHashCreateDict(0,local_50);
    *(xmlHashTablePtr *)(name_local + 0x50) = pxVar2;
    if (*(long *)(name_local + 0x50) == 0) goto LAB_00176c96;
  }
  cur = *(xmlElementPtr *)(name_local + 0x50);
  prefix = xmlSplitQName4((xmlChar *)table,(xmlChar **)&dict);
  if (prefix != (xmlChar *)0x0) {
    localName = (xmlChar *)xmlHashLookup2((xmlHashTablePtr)cur,prefix,(xmlChar *)dict);
    if (localName != (xmlChar *)0x0) {
LAB_00176c75:
      if (dict != (xmlDictPtr)0x0) {
        (*xmlFree)(dict);
      }
      return (xmlElementPtr)localName;
    }
    localName = (xmlChar *)(*xmlMalloc)(0x70);
    if (localName != (xmlChar *)0x0) {
      memset(localName,0,0x70);
      localName[8] = '\x0f';
      localName[9] = '\0';
      localName[10] = '\0';
      localName[0xb] = '\0';
      *(undefined8 *)(localName + 0x40) = *(undefined8 *)(name_local + 0x40);
      pxVar3 = xmlStrdup(prefix);
      *(xmlChar **)(localName + 0x10) = pxVar3;
      if (*(long *)(localName + 0x10) != 0) {
        *(xmlDictPtr *)(localName + 0x60) = dict;
        dict = (xmlDictPtr)0x0;
        localName[0x48] = '\0';
        localName[0x49] = '\0';
        localName[0x4a] = '\0';
        localName[0x4b] = '\0';
        iVar1 = xmlHashAdd2((xmlHashTablePtr)cur,prefix,*(xmlChar **)(localName + 0x60),localName);
        if (0 < iVar1) goto LAB_00176c75;
      }
    }
  }
LAB_00176c96:
  xmlVErrMemory((xmlValidCtxtPtr)dtd_local);
  (*xmlFree)(dict);
  xmlFreeElement((xmlElementPtr)localName);
  return (xmlElementPtr)0x0;
}

Assistant:

static xmlElementPtr
xmlGetDtdElementDesc2(xmlValidCtxtPtr ctxt, xmlDtdPtr dtd, const xmlChar *name) {
    xmlElementTablePtr table;
    xmlElementPtr cur = NULL;
    const xmlChar *localName;
    xmlChar *prefix = NULL;

    if (dtd == NULL) return(NULL);

    /*
     * Create the Element table if needed.
     */
    if (dtd->elements == NULL) {
	xmlDictPtr dict = NULL;

	if (dtd->doc != NULL)
	    dict = dtd->doc->dict;

	dtd->elements = xmlHashCreateDict(0, dict);
	if (dtd->elements == NULL)
            goto mem_error;
    }
    table = (xmlElementTablePtr) dtd->elements;

    localName = xmlSplitQName4(name, &prefix);
    if (localName == NULL)
        goto mem_error;
    cur = xmlHashLookup2(table, localName, prefix);
    if (cur == NULL) {
	cur = (xmlElementPtr) xmlMalloc(sizeof(xmlElement));
	if (cur == NULL)
            goto mem_error;
	memset(cur, 0, sizeof(xmlElement));
	cur->type = XML_ELEMENT_DECL;
        cur->doc = dtd->doc;

	/*
	 * fill the structure.
	 */
	cur->name = xmlStrdup(localName);
        if (cur->name == NULL)
            goto mem_error;
	cur->prefix = prefix;
        prefix = NULL;
	cur->etype = XML_ELEMENT_TYPE_UNDEFINED;

	if (xmlHashAdd2(table, localName, cur->prefix, cur) <= 0)
            goto mem_error;
    }

    if (prefix != NULL)
        xmlFree(prefix);
    return(cur);

mem_error:
    xmlVErrMemory(ctxt);
    xmlFree(prefix);
    xmlFreeElement(cur);
    return(NULL);
}